

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_connect(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string str;
  int count;
  bool r;
  rpc_client client;
  undefined1 in_stack_fffffffffffffb8f;
  rpc_client *in_stack_fffffffffffffb90;
  string *this;
  rpc_client *in_stack_fffffffffffffbc0;
  int local_41c;
  duration<long,std::ratio<1l,1l>> local_418 [8];
  int local_410;
  allocator local_409;
  string local_408 [35];
  byte local_3e5;
  rpc_client *in_stack_fffffffffffffc50;
  
  rest_rpc::rpc_client::rpc_client(in_stack_fffffffffffffc50);
  rest_rpc::rpc_client::enable_auto_reconnect
            (in_stack_fffffffffffffb90,(bool)in_stack_fffffffffffffb8f);
  rest_rpc::rpc_client::enable_auto_heartbeat
            (in_stack_fffffffffffffb90,(bool)in_stack_fffffffffffffb8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"127.0.0.1",&local_409);
  iVar2 = rest_rpc::rpc_client::connect
                    ((rpc_client *)&stack0xfffffffffffffc28,(int)local_408,(sockaddr *)0x2328,0);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  local_3e5 = (byte)iVar2 & 1;
  local_410 = 0;
  while( true ) {
    bVar1 = rest_rpc::rpc_client::has_connected((rpc_client *)0x1af592);
    if (bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"connected failed: ");
    iVar2 = local_410;
    local_410 = local_410 + 1;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"\n");
    local_41c = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_418,&local_41c);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffbc0);
  }
  std::operator<<((ostream *)&std::cout,"connected ok\n");
  this = (string *)&stack0xfffffffffffffbc0;
  std::__cxx11::string::string(this);
  std::operator>>((istream *)&std::cin,this);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffbc0);
  rest_rpc::rpc_client::~rpc_client(in_stack_fffffffffffffbc0);
  return;
}

Assistant:

void test_connect() {
  rpc_client client;
  client.enable_auto_reconnect(); // automatic reconnect
  client.enable_auto_heartbeat(); // automatic heartbeat
  bool r = client.connect("127.0.0.1", 9000);
  int count = 0;
  while (true) {
    if (client.has_connected()) {
      std::cout << "connected ok\n";
      break;
    } else {
      std::cout << "connected failed: " << count++ << "\n";
    }
    std::this_thread::sleep_for(std::chrono::seconds(1));
  }

  //{
  //	rpc_client client;
  //	bool r = client.connect("127.0.0.1", 9000);
  //	int count = 0;
  //	while (true) {
  //		if (client.connect()) {
  //			std::cout << "connected ok\n";
  //			break;
  //		}
  //		else {
  //			std::cout << "connected failed: " << count++ << "\n";
  //		}
  //	}
  //}

  std::string str;
  std::cin >> str;
}